

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

OPJ_BOOL opj_j2k_read_mct(opj_j2k_t *p_j2k,OPJ_BYTE *p_header_data,OPJ_UINT32 p_header_size,
                         opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  opj_mct_data_t *poVar2;
  opj_simple_mcc_decorrelation_data_t *poVar3;
  long lVar4;
  opj_mct_data_t *poVar5;
  OPJ_BYTE *__dest;
  OPJ_UINT32 OVar6;
  OPJ_UINT32 OVar7;
  char *fmt;
  long lVar8;
  OPJ_BOOL OVar9;
  uint uVar10;
  opj_tcp_t *poVar11;
  uint uVar12;
  OPJ_UINT32 l_tmp;
  uint local_3c;
  opj_mct_data_t **local_38;
  
  if (p_header_data == (OPJ_BYTE *)0x0) {
    __assert_fail("p_header_data != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x15df,
                  "OPJ_BOOL opj_j2k_read_mct(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if (p_j2k == (opj_j2k_t *)0x0) {
    __assert_fail("p_j2k != 00",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/j2k.c"
                  ,0x15e0,
                  "OPJ_BOOL opj_j2k_read_mct(opj_j2k_t *, OPJ_BYTE *, OPJ_UINT32, opj_event_mgr_t *)"
                 );
  }
  if ((p_j2k->m_specific_param).m_decoder.m_state == 0x10) {
    poVar11 = (p_j2k->m_cp).tcps + p_j2k->m_current_tile_number;
  }
  else {
    poVar11 = (p_j2k->m_specific_param).m_decoder.m_default_tcp;
  }
  if (p_header_size < 2) {
LAB_001176f3:
    OVar9 = 0;
    opj_event_msg(p_manager,1,"Error reading MCT marker\n");
  }
  else {
    opj_read_bytes_LE(p_header_data,&local_3c,2);
    if (local_3c == 0) {
      if (p_header_size < 7) goto LAB_001176f3;
      opj_read_bytes_LE(p_header_data + 2,&local_3c,2);
      poVar2 = poVar11->m_mct_records;
      OVar1 = poVar11->m_nb_mct_records;
      OVar6 = 0;
      uVar12 = local_3c & 0xff;
      poVar5 = poVar2;
      OVar7 = OVar6;
      if (OVar1 != 0) {
        do {
          OVar7 = OVar6;
          if (poVar5->m_index == uVar12) break;
          poVar5 = poVar5 + 1;
          OVar6 = OVar6 + 1;
          OVar7 = OVar1;
        } while (OVar1 != OVar6);
      }
      if (OVar7 == OVar1) {
        if (OVar1 == poVar11->m_nb_max_mct_records) {
          uVar10 = poVar11->m_nb_max_mct_records + 10;
          poVar11->m_nb_max_mct_records = uVar10;
          poVar5 = (opj_mct_data_t *)opj_realloc(poVar2,(ulong)uVar10 << 5);
          poVar2 = poVar11->m_mct_records;
          if (poVar5 == (opj_mct_data_t *)0x0) {
            local_38 = &poVar11->m_mct_records;
            opj_free(poVar2);
            *local_38 = (opj_mct_data_t *)0x0;
            local_38[1] = (opj_mct_data_t *)0x0;
            opj_event_msg(p_manager,1,"Not enough memory to read MCT marker\n");
          }
          else {
            if ((poVar5 != poVar2) && (uVar10 = poVar11->m_nb_mcc_records, (ulong)uVar10 != 0)) {
              poVar3 = poVar11->m_mcc_records;
              lVar8 = 0;
              do {
                lVar4 = *(long *)((long)&poVar3->m_decorrelation_array + lVar8);
                if (lVar4 != 0) {
                  *(long *)((long)&poVar3->m_decorrelation_array + lVar8) =
                       (lVar4 - (long)poVar2) + (long)poVar5;
                }
                lVar4 = *(long *)((long)&poVar3->m_offset_array + lVar8);
                if (lVar4 != 0) {
                  *(long *)((long)&poVar3->m_offset_array + lVar8) =
                       (lVar4 - (long)poVar2) + (long)poVar5;
                }
                lVar8 = lVar8 + 0x20;
              } while ((ulong)uVar10 << 5 != lVar8);
            }
            poVar11->m_mct_records = poVar5;
            memset(poVar5 + poVar11->m_nb_mct_records,0,
                   (ulong)(poVar11->m_nb_max_mct_records - poVar11->m_nb_mct_records) << 5);
          }
          if (poVar5 == (opj_mct_data_t *)0x0) {
            return 0;
          }
        }
        poVar5 = poVar11->m_mct_records + poVar11->m_nb_mct_records;
        poVar11->m_nb_mct_records = poVar11->m_nb_mct_records + 1;
      }
      if (poVar5->m_data != (OPJ_BYTE *)0x0) {
        opj_free(poVar5->m_data);
        poVar5->m_data = (OPJ_BYTE *)0x0;
        poVar5->m_data_size = 0;
      }
      poVar5->m_index = uVar12;
      poVar5->m_array_type = local_3c >> 8 & (MCT_TYPE_OFFSET|MCT_TYPE_DECORRELATION);
      poVar5->m_element_type = local_3c >> 10 & MCT_TYPE_DOUBLE;
      opj_read_bytes_LE(p_header_data + 4,&local_3c,2);
      if (local_3c != 0) {
        fmt = "Cannot take in charge multiple MCT markers\n";
        goto LAB_00117730;
      }
      uVar12 = p_header_size - 6;
      __dest = (OPJ_BYTE *)opj_malloc((ulong)uVar12);
      poVar5->m_data = __dest;
      if (__dest == (OPJ_BYTE *)0x0) goto LAB_001176f3;
      memcpy(__dest,p_header_data + 6,(ulong)uVar12);
      poVar5->m_data_size = uVar12;
    }
    else {
      fmt = "Cannot take in charge mct data within multiple MCT records\n";
LAB_00117730:
      opj_event_msg(p_manager,2,fmt);
    }
    OVar9 = 1;
  }
  return OVar9;
}

Assistant:

static OPJ_BOOL opj_j2k_read_mct(opj_j2k_t *p_j2k,
                                 OPJ_BYTE * p_header_data,
                                 OPJ_UINT32 p_header_size,
                                 opj_event_mgr_t * p_manager
                                )
{
    OPJ_UINT32 i;
    opj_tcp_t *l_tcp = 00;
    OPJ_UINT32 l_tmp;
    OPJ_UINT32 l_indix;
    opj_mct_data_t * l_mct_data;

    /* preconditions */
    assert(p_header_data != 00);
    assert(p_j2k != 00);

    l_tcp = p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_TPH ?
            &p_j2k->m_cp.tcps[p_j2k->m_current_tile_number] :
            p_j2k->m_specific_param.m_decoder.m_default_tcp;

    if (p_header_size < 2) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCT marker\n");
        return OPJ_FALSE;
    }

    /* first marker */
    opj_read_bytes(p_header_data, &l_tmp, 2);                       /* Zmct */
    p_header_data += 2;
    if (l_tmp != 0) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Cannot take in charge mct data within multiple MCT records\n");
        return OPJ_TRUE;
    }

    if (p_header_size <= 6) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCT marker\n");
        return OPJ_FALSE;
    }

    /* Imct -> no need for other values, take the first, type is double with decorrelation x0000 1101 0000 0000*/
    opj_read_bytes(p_header_data, &l_tmp, 2);                       /* Imct */
    p_header_data += 2;

    l_indix = l_tmp & 0xff;
    l_mct_data = l_tcp->m_mct_records;

    for (i = 0; i < l_tcp->m_nb_mct_records; ++i) {
        if (l_mct_data->m_index == l_indix) {
            break;
        }
        ++l_mct_data;
    }

    /* NOT FOUND */
    if (i == l_tcp->m_nb_mct_records) {
        if (l_tcp->m_nb_mct_records == l_tcp->m_nb_max_mct_records) {
            opj_mct_data_t *new_mct_records;
            l_tcp->m_nb_max_mct_records += OPJ_J2K_MCT_DEFAULT_NB_RECORDS;

            new_mct_records = (opj_mct_data_t *) opj_realloc(l_tcp->m_mct_records,
                              l_tcp->m_nb_max_mct_records * sizeof(opj_mct_data_t));
            if (! new_mct_records) {
                opj_free(l_tcp->m_mct_records);
                l_tcp->m_mct_records = NULL;
                l_tcp->m_nb_max_mct_records = 0;
                l_tcp->m_nb_mct_records = 0;
                opj_event_msg(p_manager, EVT_ERROR, "Not enough memory to read MCT marker\n");
                return OPJ_FALSE;
            }

            /* Update m_mcc_records[].m_offset_array and m_decorrelation_array
             * to point to the new addresses */
            if (new_mct_records != l_tcp->m_mct_records) {
                for (i = 0; i < l_tcp->m_nb_mcc_records; ++i) {
                    opj_simple_mcc_decorrelation_data_t* l_mcc_record =
                        &(l_tcp->m_mcc_records[i]);
                    if (l_mcc_record->m_decorrelation_array) {
                        l_mcc_record->m_decorrelation_array =
                            new_mct_records +
                            (l_mcc_record->m_decorrelation_array -
                             l_tcp->m_mct_records);
                    }
                    if (l_mcc_record->m_offset_array) {
                        l_mcc_record->m_offset_array =
                            new_mct_records +
                            (l_mcc_record->m_offset_array -
                             l_tcp->m_mct_records);
                    }
                }
            }

            l_tcp->m_mct_records = new_mct_records;
            l_mct_data = l_tcp->m_mct_records + l_tcp->m_nb_mct_records;
            memset(l_mct_data, 0, (l_tcp->m_nb_max_mct_records - l_tcp->m_nb_mct_records) *
                   sizeof(opj_mct_data_t));
        }

        l_mct_data = l_tcp->m_mct_records + l_tcp->m_nb_mct_records;
        ++l_tcp->m_nb_mct_records;
    }

    if (l_mct_data->m_data) {
        opj_free(l_mct_data->m_data);
        l_mct_data->m_data = 00;
        l_mct_data->m_data_size = 0;
    }

    l_mct_data->m_index = l_indix;
    l_mct_data->m_array_type = (J2K_MCT_ARRAY_TYPE)((l_tmp  >> 8) & 3);
    l_mct_data->m_element_type = (J2K_MCT_ELEMENT_TYPE)((l_tmp  >> 10) & 3);

    opj_read_bytes(p_header_data, &l_tmp, 2);                       /* Ymct */
    p_header_data += 2;
    if (l_tmp != 0) {
        opj_event_msg(p_manager, EVT_WARNING,
                      "Cannot take in charge multiple MCT markers\n");
        return OPJ_TRUE;
    }

    p_header_size -= 6;

    l_mct_data->m_data = (OPJ_BYTE*)opj_malloc(p_header_size);
    if (! l_mct_data->m_data) {
        opj_event_msg(p_manager, EVT_ERROR, "Error reading MCT marker\n");
        return OPJ_FALSE;
    }
    memcpy(l_mct_data->m_data, p_header_data, p_header_size);

    l_mct_data->m_data_size = p_header_size;

    return OPJ_TRUE;
}